

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListBuilder * __thiscall
capnp::_::PointerBuilder::getList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,ElementSize elementSize,
          word *defaultValue)

{
  WirePointer *pWVar1;
  ushort uVar2;
  unsigned_short uVar3;
  ushort uVar4;
  ushort uVar5;
  CapTableBuilder *capTable;
  word *pwVar6;
  uint64_t uVar7;
  WirePointer *pWVar8;
  SegmentBuilder *this_00;
  char *pcVar9;
  uint uVar10;
  int line;
  int iVar11;
  ulong uVar12;
  WirePointer *pWVar13;
  char *condition;
  char *macroArgs;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *this_01;
  ElementSize oldSize;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  unsigned_short pointerCount;
  undefined2 uStack_46;
  unsigned_short dataSize;
  undefined2 uStack_42;
  SegmentBuilder *local_40;
  WirePointer *local_38;
  
  local_38 = this->pointer;
  local_40 = this->segment;
  capTable = this->capTable;
  uVar10 = (local_38->offsetAndKind).value;
  if ((local_38->field_1).upper32Bits == 0 && uVar10 == 0) goto LAB_00204f47;
  pWVar8 = local_38 + (long)((int)uVar10 >> 2) + 1;
  do {
    pWVar13 = local_38;
    this_00 = local_40;
    if ((uVar10 & 3) == 2) {
      this_00 = BuilderArena::getSegment
                          ((BuilderArena *)(local_40->super_SegmentReader).arena,
                           (SegmentId)(local_38->field_1).structRef);
      uVar10 = (pWVar13->offsetAndKind).value;
      pwVar6 = (this_00->super_SegmentReader).ptr.ptr;
      uVar12 = (ulong)(uVar10 & 0xfffffff8);
      pWVar1 = (WirePointer *)((long)&pwVar6->content + uVar12);
      pWVar13 = (WirePointer *)((long)&pwVar6[1].content + uVar12);
      if ((uVar10 & 4) == 0) {
        pWVar8 = pWVar13 + ((int)(pWVar1->offsetAndKind).value >> 2);
        pWVar13 = pWVar1;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)(pWVar1->field_1).structRef);
        pWVar8 = (WirePointer *)
                 ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((pWVar1->offsetAndKind).value & 0xfffffff8));
      }
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    _kjCondition.left = (pWVar13->offsetAndKind).value & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    if (_kjCondition.left != LIST) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x509,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getWritableListPointer() but existing pointer is not a list.\""
                 ,&_kjCondition,
                 (char (*) [85])
                 "Schema mismatch: Called getWritableListPointer() but existing pointer is not a list."
                );
      kj::_::Debug::Fault::~Fault(&f);
      goto LAB_00204f47;
    }
    oldSize = *(ElementSize *)&pWVar13->field_1 & INLINE_COMPOSITE;
    if (oldSize != INLINE_COMPOSITE) {
      iVar11 = 1;
      _dataSize = *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)oldSize * 4);
      _pointerCount = (uint)(oldSize == POINTER);
      _kjCondition._0_8_ = &oldSize;
      if (elementSize == BIT) {
        _kjCondition.op.content.ptr =
             "d: expected (kj::arrayPtr(\"az\", 2)) == (builder.slice(1, 3))";
        _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_b08b;
        if (oldSize != BIT) {
          pcVar9 = "Schema mismatch: Found non-bit list where bit list was expected.";
          condition = "oldSize == ElementSize::BIT";
          macroArgs = 
          "_kjCondition,\"Schema mismatch: Found non-bit list where bit list was expected.\"";
          line = 0x54e;
          goto LAB_002052ea;
        }
LAB_0020516c:
        _kjCondition.result = true;
        _kjCondition._25_7_ = 0;
        uVar10 = (pWVar13->field_1).upper32Bits;
        __return_storage_ptr__->segment = this_00;
        __return_storage_ptr__->capTable = capTable;
        __return_storage_ptr__->ptr = (byte *)pWVar8;
        __return_storage_ptr__->elementCount = uVar10 >> 3;
        __return_storage_ptr__->step = (uint)(oldSize == POINTER) * 0x40 + _dataSize;
        __return_storage_ptr__->structDataSize = _dataSize;
        __return_storage_ptr__->structPointerCount = (ushort)(oldSize == POINTER);
        __return_storage_ptr__->elementSize = oldSize;
      }
      else {
        _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_b81a;
        if (oldSize != BIT) {
          _kjCondition._0_8_ = &dataSize;
          _kjCondition.op.content.ptr =
               (char *)(ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)elementSize * 4);
          if (_dataSize < *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)elementSize * 4)) {
            pcVar9 = "dataSize >= dataBitsPerElement(elementSize) * ELEMENTS";
            iVar11 = 0x557;
          }
          else {
            _kjCondition._0_8_ = &pointerCount;
            _kjCondition.op.content.ptr = (char *)(ulong)(elementSize == POINTER);
            _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_b80e;
            if (elementSize != POINTER || oldSize == POINTER) goto LAB_0020516c;
            pcVar9 = "pointerCount >= pointersPerElement(elementSize) * ELEMENTS";
            iVar11 = 0x55b;
          }
          _kjCondition.result = true;
          _kjCondition._25_7_ = 0;
          _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_b80e;
          this_01 = (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)&f;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[73]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,iVar11,FAILED,pcVar9,
                     "_kjCondition,\"Schema mismatch: Existing list value is incompatible with expected type.\""
                     ,(DebugComparison<unsigned_int_&,_unsigned_int> *)&_kjCondition,
                     (char (*) [73])
                     "Schema mismatch: Existing list value is incompatible with expected type.");
          goto LAB_00205404;
        }
        pcVar9 = "Schema mismatch: Found bit list where non-bit list was expected.";
        condition = "oldSize != ElementSize::BIT";
        macroArgs = 
        "_kjCondition,\"Schema mismatch: Found bit list where non-bit list was expected.\"";
        line = 0x553;
LAB_002052ea:
        _kjCondition.result = true;
        _kjCondition._25_7_ = 0;
        _kjCondition.op.content.ptr =
             "d: expected (kj::arrayPtr(\"az\", 2)) == (builder.slice(1, 3))";
        iVar11 = 4;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize&,capnp::ElementSize>&,char_const(&)[65]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,line,FAILED,condition,macroArgs,
                   (DebugComparison<capnp::ElementSize_&,_capnp::ElementSize> *)&_kjCondition,
                   (char (*) [65])pcVar9);
        kj::_::Debug::Fault::~Fault(&f);
      }
      goto LAB_00205411;
    }
    uVar10 = (uint)*(uint64_t *)&(pWVar8->offsetAndKind).value;
    _kjCondition.result = (uVar10 & 3) == 0;
    _kjCondition._0_8_ = (ulong)uVar10 & 0xffffffff00000003;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x518,FAILED,"tag->kind() == WirePointer::STRUCT",
                 "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
                 &_kjCondition,
                 (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.");
      kj::_::Debug::Fault::fatal(&f);
    }
    pWVar13 = pWVar8 + 1;
    uVar2 = *(ushort *)&pWVar8->field_1;
    _dataSize = CONCAT22(uStack_42,uVar2);
    uVar3 = (pWVar8->field_1).structRef.ptrCount.value;
    _pointerCount = CONCAT22(uStack_46,uVar3);
    switch(elementSize) {
    case BIT:
      this_01 = &_kjCondition;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[123]>
                ((Fault *)this_01,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x526,FAILED,(char *)0x0,
                 "\"Schema mismatch: Found struct list where bit list was expected; upgrading boolean \" \"lists to structs is no longer supported.\""
                 ,(char (*) [123])
                  "Schema mismatch: Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
                );
      break;
    case BYTE:
    case TWO_BYTES:
    case FOUR_BYTES:
    case EIGHT_BYTES:
      _kjCondition._0_8_ = &dataSize;
      _kjCondition.op.content.ptr = (char *)0x1;
      _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_b80e;
      _kjCondition.result = true;
      _kjCondition._25_7_ = 0;
      if ((ulong)uVar2 != 0) goto switchD_00205095_default;
      pcVar9 = "dataSize >= ONE * WORDS";
      iVar11 = 0x530;
LAB_0020534c:
      _kjCondition.op.content.ptr = (char *)0x1;
      _kjCondition.result = true;
      _kjCondition._25_7_ = 0;
      _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_b80e;
      this_01 = (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)&f;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short&,unsigned_int>&,char_const(&)[73]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,iVar11,FAILED,pcVar9,
                 "_kjCondition,\"Schema mismatch: Existing list value is incompatible with expected type.\""
                 ,(DebugComparison<unsigned_short_&,_unsigned_int> *)&_kjCondition,
                 (char (*) [73])
                 "Schema mismatch: Existing list value is incompatible with expected type.");
      break;
    case POINTER:
      _kjCondition._0_8_ = &pointerCount;
      _kjCondition.op.content.ptr = (char *)0x1;
      _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_b80e;
      _kjCondition.result = true;
      _kjCondition._25_7_ = 0;
      if (uVar3 == 0) {
        pcVar9 = "pointerCount >= ONE * POINTERS";
        iVar11 = 0x537;
        goto LAB_0020534c;
      }
      pWVar13 = pWVar13 + uVar2;
    default:
switchD_00205095_default:
      uVar4 = (pWVar8->field_1).structRef.dataSize.value;
      uVar5 = (pWVar8->field_1).structRef.ptrCount.value;
      uVar7 = *(uint64_t *)&(pWVar8->offsetAndKind).value;
      __return_storage_ptr__->segment = this_00;
      __return_storage_ptr__->capTable = capTable;
      __return_storage_ptr__->ptr = (byte *)pWVar13;
      __return_storage_ptr__->elementCount = (uint)uVar7 >> 2 & 0x1fffffff;
      __return_storage_ptr__->step = ((uint)uVar5 + (uint)uVar4) * 0x40;
      __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
      __return_storage_ptr__->structPointerCount = uVar3;
      __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
      iVar11 = 1;
      goto LAB_00205411;
    case INLINE_COMPOSITE:
      kj::_::unreachable();
    }
LAB_00205404:
    kj::_::Debug::Fault::~Fault((Fault *)this_01);
    iVar11 = 4;
LAB_00205411:
    if (iVar11 != 4) {
      return __return_storage_ptr__;
    }
LAB_00204f47:
    if (((WirePointer *)defaultValue == (WirePointer *)0x0) ||
       ((((WirePointer *)defaultValue)->field_1).upper32Bits == 0 &&
        (((WirePointer *)defaultValue)->offsetAndKind).value == 0)) {
      __return_storage_ptr__->ptr = (byte *)0x0;
      __return_storage_ptr__->elementCount = 0;
      __return_storage_ptr__->step = 0;
      __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
      __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
      __return_storage_ptr__->elementSize = elementSize;
      return __return_storage_ptr__;
    }
    pWVar8 = (WirePointer *)
             WireHelpers::copyMessage(&local_40,capTable,&local_38,(WirePointer *)defaultValue);
    uVar10 = (local_38->offsetAndKind).value;
    defaultValue = (word *)0x0;
  } while( true );
}

Assistant:

ListBuilder PointerBuilder::getList(ElementSize elementSize, const word* defaultValue) {
  return WireHelpers::getWritableListPointer(pointer, segment, capTable, elementSize, defaultValue);
}